

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

bool __thiscall wallet::WalletBatch::WriteBestBlock(WalletBatch *this,CBlockLocator *locator)

{
  bool bVar1;
  long in_FS_OFFSET;
  _Vector_base<uint256,_std::allocator<uint256>_> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  WriteIC<std::__cxx11::string,CBlockLocator>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  DBKeys::BESTBLOCK_abi_cxx11_,(CBlockLocator *)&local_38,true);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base(&local_38);
  bVar1 = WriteIC<std::__cxx11::string,CBlockLocator>
                    (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          DBKeys::BESTBLOCK_NOMERKLE_abi_cxx11_,locator,true);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteBestBlock(const CBlockLocator& locator)
{
    WriteIC(DBKeys::BESTBLOCK, CBlockLocator()); // Write empty block locator so versions that require a merkle branch automatically rescan
    return WriteIC(DBKeys::BESTBLOCK_NOMERKLE, locator);
}